

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O2

void __thiscall
duckdb::AlpRDVectorState<float>::LoadValues<false>
          (AlpRDVectorState<float> *this,EXACT_TYPE *values_buffer,idx_t count)

{
  *values_buffer = 0;
  alp::AlpRDDecompression<float>::Decompress
            (this->left_encoded,this->right_encoded,this->left_parts_dict,values_buffer,count,
             this->exceptions_count,this->exceptions,this->exceptions_positions,this->left_bit_width
             ,this->right_bit_width);
  return;
}

Assistant:

void LoadValues(EXACT_TYPE *values_buffer, idx_t count) {
		if (SKIP) {
			return;
		}
		values_buffer[0] = (EXACT_TYPE)0;
		alp::AlpRDDecompression<T>::Decompress(left_encoded, right_encoded, left_parts_dict, values_buffer, count,
		                                       exceptions_count, exceptions, exceptions_positions, left_bit_width,
		                                       right_bit_width);
	}